

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O3

void benchmark::BenchmarkReporter::ComputeStats
               (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *reports,Run *mean_data,Run *stddev_data)

{
  pointer pRVar1;
  size_t sVar2;
  long lVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  pointer pRVar10;
  char *check;
  pointer pRVar11;
  ulong uVar12;
  size_type *psVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar19 [16];
  long lVar17;
  double dVar25;
  long lVar26;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar18;
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar29;
  long lVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double local_f8;
  double dStack_f0;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  CheckHandler local_88;
  CheckHandler local_80 [2];
  ostream local_70 [16];
  Run *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  uVar12 = ((long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (uVar12 < 2) {
    internal::CheckHandler::CheckHandler
              (&local_88,"reports.size() >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
               ,"ComputeStats",0x1c);
  }
  else {
    local_88.log_ = internal::GetNullLogInstance();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.log_,"Cannot compute stats for less than 2 reports",0x2c);
  if (uVar12 < 2) {
    internal::CheckHandler::~CheckHandler(&local_88);
  }
  pRVar11 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pRVar10 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = pRVar11->iterations;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  if (pRVar11 == pRVar10) {
    lVar29 = 0;
    lVar32 = 0;
    local_f8 = 0.0;
    dStack_f0 = 0.0;
    lVar17 = 0;
    lVar26 = 0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    local_b8 = 0.0;
    dStack_b0 = 0.0;
  }
  else {
    lVar29 = 0;
    lVar32 = 0;
    local_f8 = 0.0;
    dStack_f0 = 0.0;
    lVar17 = 0;
    lVar26 = 0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    do {
      pRVar1 = (reports->
               super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar2 = (pRVar1->benchmark_name)._M_string_length;
      if ((sVar2 != (pRVar11->benchmark_name)._M_string_length) ||
         ((sVar2 != 0 &&
          (iVar8 = bcmp((pRVar1->benchmark_name)._M_dataplus._M_p,
                        (pRVar11->benchmark_name)._M_dataplus._M_p,sVar2), iVar8 != 0)))) {
        check = "(reports[0].benchmark_name) == (run.benchmark_name)";
        iVar8 = 0x28;
LAB_0010e362:
        internal::CheckHandler::CheckHandler
                  (local_80,check,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                   ,"ComputeStats",iVar8);
        internal::CheckHandler::~CheckHandler(local_80);
      }
      internal::GetNullLogInstance();
      if (lVar9 != pRVar11->iterations) {
        check = "(run_iterations) == (run.iterations)";
        iVar8 = 0x29;
        goto LAB_0010e362;
      }
      internal::GetNullLogInstance();
      lVar3 = pRVar11->iterations;
      auVar31._0_8_ = (double)lVar3;
      auVar19._0_8_ = pRVar11->real_accumulated_time;
      auVar19._8_8_ = pRVar11->cpu_accumulated_time;
      auVar31._8_8_ = auVar31._0_8_;
      auVar19 = divpd(auVar19,auVar31);
      dVar16 = auVar19._0_8_;
      dVar25 = auVar19._8_8_;
      local_f8 = local_f8 + dVar16 * auVar31._0_8_;
      dStack_f0 = dStack_f0 + dVar25 * auVar31._0_8_;
      auVar27._8_4_ = (int)lVar3;
      auVar27._0_8_ = lVar3;
      auVar27._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar29 = lVar29 + lVar3;
      lVar32 = lVar32 + auVar27._8_8_;
      dVar18 = pRVar11->bytes_per_second;
      dVar14 = pRVar11->items_per_second;
      local_c8 = local_c8 + dVar18 * auVar31._0_8_;
      dStack_c0 = dStack_c0 + dVar14 * auVar31._0_8_;
      local_b8 = local_b8 + dVar16 * dVar16 * auVar31._0_8_;
      dStack_b0 = dStack_b0 + dVar25 * dVar25 * auVar31._0_8_;
      local_d8 = local_d8 + dVar18 * dVar18 * auVar31._0_8_;
      dStack_d0 = dStack_d0 + dVar14 * dVar14 * auVar31._0_8_;
      lVar17 = lVar17 + lVar3;
      lVar26 = lVar26 + auVar27._8_8_;
      pRVar11 = pRVar11 + 1;
    } while (pRVar11 != pRVar10);
    pRVar11 = (reports->
              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  iStack_9c = (int)((ulong)lVar26 >> 0x20);
  iStack_a0 = (int)lVar26;
  iStack_a4 = (int)((ulong)lVar17 >> 0x20);
  local_a8 = (int)lVar17;
  iStack_dc = (int)((ulong)lVar32 >> 0x20);
  iStack_e0 = (int)lVar32;
  iStack_e4 = (int)((ulong)lVar29 >> 0x20);
  local_e8 = (int)lVar29;
  pcVar4 = (pRVar11->benchmark_name)._M_dataplus._M_p;
  local_80[0].log_ = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar4,pcVar4 + (pRVar11->benchmark_name)._M_string_length);
  std::__cxx11::string::append((char *)local_80);
  std::__cxx11::string::operator=((string *)mean_data,(string *)local_80);
  if (local_80[0].log_ != local_70) {
    operator_delete(local_80[0].log_);
  }
  mean_data->iterations = lVar9;
  auVar19 = _DAT_0011df70;
  auVar6._8_4_ = iStack_e0;
  auVar6._0_8_ = lVar29;
  auVar6._12_4_ = iStack_dc;
  auVar20._0_8_ = (double)lVar29;
  auVar20._8_8_ = (double)auVar6._8_8_;
  local_58 = divpd(_DAT_0011df70,auVar20);
  auVar33._0_8_ = local_f8 * local_58._0_8_;
  auVar33._8_8_ = dStack_f0 * local_58._8_8_;
  auVar21._0_4_ = -(uint)(local_e8 == 0);
  auVar21._4_4_ = -(uint)(iStack_e4 == 0);
  auVar21._8_4_ = -(uint)(iStack_e0 == 0);
  auVar21._12_4_ = -(uint)(iStack_dc == 0);
  auVar30._4_4_ = auVar21._0_4_;
  auVar30._0_4_ = auVar21._4_4_;
  auVar30._8_4_ = auVar21._12_4_;
  auVar30._12_4_ = auVar21._8_4_;
  auVar31 = ~(auVar30 & auVar21) & auVar33;
  auVar7._8_4_ = iStack_a0;
  auVar7._0_8_ = lVar17;
  auVar7._12_4_ = iStack_9c;
  auVar22._0_8_ = (double)lVar17;
  mean_data->real_accumulated_time = (double)lVar9 * auVar31._0_8_;
  mean_data->cpu_accumulated_time = (double)lVar9 * auVar31._8_8_;
  auVar22._8_8_ = (double)auVar7._8_8_;
  local_48._0_16_ = divpd(auVar19,auVar22);
  auVar28._0_8_ = local_c8 * local_48._0_8_;
  auVar28._8_8_ = dStack_c0 * local_48._8_8_;
  auVar15._0_4_ = -(uint)(local_a8 == 0);
  auVar15._4_4_ = -(uint)(iStack_a4 == 0);
  auVar15._8_4_ = -(uint)(iStack_a0 == 0);
  auVar15._12_4_ = -(uint)(iStack_9c == 0);
  auVar23._4_4_ = auVar15._0_4_;
  auVar23._0_4_ = auVar15._4_4_;
  auVar23._8_4_ = auVar15._12_4_;
  auVar23._12_4_ = auVar15._8_4_;
  auVar19 = ~(auVar23 & auVar15) & auVar28;
  mean_data->bytes_per_second = (double)auVar19._0_8_;
  mean_data->items_per_second = (double)auVar19._8_8_;
  local_60 = mean_data;
  std::__cxx11::string::_M_assign((string *)&mean_data->report_label);
  pRVar10 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10 >> 4) *
           0x6db6db6db6db6db7;
  if (1 < uVar12) {
    sVar2 = (pRVar10->report_label)._M_string_length;
    lVar9 = uVar12 - 1;
    psVar13 = &pRVar10[1].report_label._M_string_length;
    do {
      if ((*psVar13 != sVar2) ||
         ((sVar2 != 0 &&
          (iVar8 = bcmp((((string *)(psVar13 + -1))->_M_dataplus)._M_p,
                        (pRVar10->report_label)._M_dataplus._M_p,sVar2), iVar8 != 0)))) {
        std::__cxx11::string::_M_replace
                  ((ulong)&mean_data->report_label,0,
                   (char *)(local_60->report_label)._M_string_length,0x11e60e);
        pRVar10 = (reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        break;
      }
      psVar13 = psVar13 + 0xe;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  _Var5._M_p = (pRVar10->benchmark_name)._M_dataplus._M_p;
  local_80[0].log_ = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,_Var5._M_p,_Var5._M_p + (pRVar10->benchmark_name)._M_string_length);
  std::__cxx11::string::append((char *)local_80);
  std::__cxx11::string::operator=((string *)stddev_data,(string *)local_80);
  if (local_80[0].log_ != local_70) {
    operator_delete(local_80[0].log_);
  }
  std::__cxx11::string::_M_assign((string *)&stddev_data->report_label);
  stddev_data->iterations = 0;
  dVar18 = 0.0;
  if (lVar29 != 0) {
    dVar14 = local_b8 * (double)local_58._0_8_ - auVar33._0_8_ * auVar33._0_8_;
    dVar18 = 0.0;
    if (0.0 <= dVar14) {
      if (dVar14 < 0.0) {
        dVar18 = sqrt(dVar14);
      }
      else {
        dVar18 = SQRT(dVar14);
      }
    }
  }
  dVar14 = 0.0;
  stddev_data->real_accumulated_time = dVar18;
  if (lVar29 != 0) {
    dVar18 = dStack_b0 * (double)local_58._8_8_ - auVar33._8_8_ * auVar33._8_8_;
    if (0.0 <= dVar18) {
      if (dVar18 < 0.0) {
        dVar14 = sqrt(dVar18);
      }
      else {
        dVar14 = SQRT(dVar18);
      }
    }
  }
  auVar24._0_4_ = -(uint)(local_a8 == 0);
  auVar24._4_4_ = -(uint)(iStack_a4 == 0);
  auVar24._8_4_ = -(uint)(iStack_a0 == 0);
  auVar24._12_4_ = -(uint)(iStack_9c == 0);
  auVar34._4_4_ = auVar24._0_4_;
  auVar34._0_4_ = auVar24._4_4_;
  auVar34._8_4_ = auVar24._12_4_;
  auVar34._12_4_ = auVar24._8_4_;
  stddev_data->cpu_accumulated_time = dVar14;
  dVar18 = 0.0;
  if ((auVar34 & auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar14 = local_d8 * (double)local_48._0_8_ - auVar28._0_8_ * auVar28._0_8_;
    dVar18 = 0.0;
    if (0.0 <= dVar14) {
      if (dVar14 < 0.0) {
        dVar18 = sqrt(dVar14);
      }
      else {
        dVar18 = SQRT(dVar14);
      }
    }
  }
  dVar14 = 0.0;
  stddev_data->bytes_per_second = dVar18;
  if ((auVar34 & auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar18 = dStack_d0 * (double)local_48._8_8_ - auVar28._8_8_ * auVar28._8_8_;
    if (0.0 <= dVar18) {
      if (dVar18 < 0.0) {
        dVar14 = sqrt(dVar18);
      }
      else {
        dVar14 = SQRT(dVar18);
      }
    }
  }
  stddev_data->items_per_second = dVar14;
  return;
}

Assistant:

void BenchmarkReporter::ComputeStats(
    const std::vector<Run>& reports,
    Run* mean_data, Run* stddev_data) {
  CHECK(reports.size() >= 2) << "Cannot compute stats for less than 2 reports";
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time/run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time/run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  mean_data->benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data->iterations = run_iterations;
  mean_data->real_accumulated_time = real_accumulated_time_stat.Mean() *
                                     run_iterations;
  mean_data->cpu_accumulated_time = cpu_accumulated_time_stat.Mean() *
                                    run_iterations;
  mean_data->bytes_per_second = bytes_per_second_stat.Mean();
  mean_data->items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data->report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data->report_label = "";
      break;
    }
  }

  stddev_data->benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data->report_label = mean_data->report_label;
  stddev_data->iterations = 0;
  stddev_data->real_accumulated_time =
      real_accumulated_time_stat.StdDev();
  stddev_data->cpu_accumulated_time =
      cpu_accumulated_time_stat.StdDev();
  stddev_data->bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data->items_per_second = items_per_second_stat.StdDev();
}